

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O2

void __thiscall nvim::Nvim::buf_del_var(Nvim *this,Buffer buffer,string *name)

{
  allocator local_49;
  Buffer local_48;
  string local_40;
  
  local_48 = buffer;
  std::__cxx11::string::string((string *)&local_40,"nvim_buf_del_var",&local_49);
  NvimRPC::call<long,std::__cxx11::string>(&this->client_,&local_40,(nullptr_t)0x0,&local_48,name);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Nvim::buf_del_var(Buffer buffer, const std::string& name) {
    client_.call("nvim_buf_del_var", nullptr, buffer, name);
}